

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

void re2::PrefixSuccessor(string *prefix)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  
  while( true ) {
    sVar2 = prefix->_M_string_length;
    if (sVar2 == 0) {
      return;
    }
    pcVar3 = (prefix->_M_dataplus)._M_p;
    cVar1 = pcVar3[sVar2 - 1];
    if (cVar1 != -1) break;
    std::__cxx11::string::pop_back();
  }
  pcVar3[sVar2 - 1] = cVar1 + '\x01';
  return;
}

Assistant:

void PrefixSuccessor(std::string* prefix) {
  // We can increment the last character in the string and be done
  // unless that character is 255, in which case we have to erase the
  // last character and increment the previous character, unless that
  // is 255, etc. If the string is empty or consists entirely of
  // 255's, we just return the empty string.
  while (!prefix->empty()) {
    char& c = prefix->back();
    if (c == '\xff') {  // char literal avoids signed/unsigned.
      prefix->pop_back();
    } else {
      ++c;
      break;
    }
  }
}